

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeSortSubtaskCleanup(sqlite3 *db,SortSubtask *pTask)

{
  SortSubtask *pTask_local;
  sqlite3 *db_local;
  
  sqlite3DbFree(db,pTask->pUnpacked);
  if ((pTask->list).aMemory == (u8 *)0x0) {
    vdbeSorterRecordFree((sqlite3 *)0x0,(pTask->list).pList);
  }
  else {
    sqlite3_free((pTask->list).aMemory);
  }
  if ((pTask->file).pFd != (sqlite3_file *)0x0) {
    sqlite3OsCloseFree((pTask->file).pFd);
  }
  if ((pTask->file2).pFd != (sqlite3_file *)0x0) {
    sqlite3OsCloseFree((pTask->file2).pFd);
  }
  memset(pTask,0,0x68);
  return;
}

Assistant:

static void vdbeSortSubtaskCleanup(sqlite3 *db, SortSubtask *pTask){
  sqlite3DbFree(db, pTask->pUnpacked);
#if SQLITE_MAX_WORKER_THREADS>0
  /* pTask->list.aMemory can only be non-zero if it was handed memory
  ** from the main thread.  That only occurs SQLITE_MAX_WORKER_THREADS>0 */
  if( pTask->list.aMemory ){
    sqlite3_free(pTask->list.aMemory);
  }else
#endif
  {
    assert( pTask->list.aMemory==0 );
    vdbeSorterRecordFree(0, pTask->list.pList);
  }
  if( pTask->file.pFd ){
    sqlite3OsCloseFree(pTask->file.pFd);
  }
  if( pTask->file2.pFd ){
    sqlite3OsCloseFree(pTask->file2.pFd);
  }
  memset(pTask, 0, sizeof(SortSubtask));
}